

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_GLSL_SETP(Context *ctx)

{
  int iVar1;
  char *pcVar2;
  char *comp_1;
  char *comp;
  char code [128];
  char src1 [64];
  char src0 [64];
  int vecsize;
  Context *ctx_local;
  
  iVar1 = vecsize_from_writemask((ctx->dest_arg).writemask);
  make_GLSL_srcarg_string_masked(ctx,0,src1 + 0x38,0x40);
  make_GLSL_srcarg_string_masked(ctx,1,code + 0x78,0x40);
  if (iVar1 == 1) {
    pcVar2 = get_GLSL_comparison_string_scalar(ctx);
    make_GLSL_destarg_assign(ctx,(char *)&comp,0x80,"(%s %s %s)",src1 + 0x38,pcVar2,code + 0x78);
  }
  else {
    pcVar2 = get_GLSL_comparison_string_vector(ctx);
    make_GLSL_destarg_assign(ctx,(char *)&comp,0x80,"%s(%s, %s)",pcVar2,src1 + 0x38,code + 0x78);
  }
  output_line(ctx,"%s",&comp);
  return;
}

Assistant:

static void emit_GLSL_SETP(Context *ctx)
{
    const int vecsize = vecsize_from_writemask(ctx->dest_arg.writemask);
    char src0[64]; make_GLSL_srcarg_string_masked(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_GLSL_srcarg_string_masked(ctx, 1, src1, sizeof (src1));
    char code[128];

    // destination is always predicate register (which is type bvec4).
    if (vecsize == 1)
    {
        const char *comp = get_GLSL_comparison_string_scalar(ctx);
        make_GLSL_destarg_assign(ctx, code, sizeof (code),
                                 "(%s %s %s)", src0, comp, src1);
    } // if
    else
    {
        const char *comp = get_GLSL_comparison_string_vector(ctx);
        make_GLSL_destarg_assign(ctx, code, sizeof (code),
                                 "%s(%s, %s)", comp, src0, src1);
    } // else

    output_line(ctx, "%s", code);
}